

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

int brynet::net::HTTPParser::sHeadComplete(http_parser *hp)

{
  FILE *__stream;
  ulong uVar1;
  string *psVar2;
  mapped_type *this;
  char *buf;
  size_t buflen;
  undefined8 uVar3;
  long lVar4;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [36];
  int local_44;
  undefined1 local_40 [4];
  int result;
  http_parser_url u;
  HTTPParser *httpParser;
  http_parser *hp_local;
  
  u.field_data._20_8_ = hp->data;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = (string *)(u.field_data._20_8_ + 0xa0);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(u.field_data._20_8_ + 0x120),(key_type *)(u.field_data._20_8_ + 0x80));
    std::__cxx11::string::operator=((string *)this,psVar2);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    buf = (char *)std::__cxx11::string::data();
    buflen = std::__cxx11::string::size();
    local_44 = http_parser_parse_url(buf,buflen,0,(http_parser_url *)local_40);
    __stream = _stderr;
    if (local_44 == 0) {
      if ((local_40._0_2_ & 8) == 0) {
        uVar3 = std::__cxx11::string::c_str();
        fprintf(__stream,"\n\n*** failed to parse PATH in URL %s ***\n\n",uVar3);
        hp_local._4_4_ = -1;
      }
      else {
        lVar4 = std::__cxx11::string::data();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_68,(char *)(lVar4 + (ulong)u.field_data[1].off),(ulong)u.field_data[1].len,
                   &local_69);
        std::__cxx11::string::operator=((string *)(u.field_data._20_8_ + 0xc0),local_68);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        if ((local_40._0_2_ & 0x10) != 0) {
          lVar4 = std::__cxx11::string::data();
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a0,(char *)(lVar4 + (ulong)u.field_data[2].off),
                     (ulong)u.field_data[2].len,&local_a1);
          std::__cxx11::string::operator=((string *)(u.field_data._20_8_ + 0xe0),local_a0);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
        hp_local._4_4_ = 0;
      }
    }
    else {
      hp_local._4_4_ = -1;
    }
  }
  else {
    hp_local._4_4_ = 0;
  }
  return hp_local._4_4_;
}

Assistant:

int HTTPParser::sHeadComplete(http_parser* hp)
{
    HTTPParser* httpParser = (HTTPParser*)hp->data;
    if (!httpParser->mCurrentField.empty())
    {
        httpParser->mHeadValues[httpParser->mCurrentField] = httpParser->mCurrentValue;
    }

    if (httpParser->mUrl.empty())
    {
        return 0;
    }

    struct http_parser_url u;

    int result = http_parser_parse_url(httpParser->mUrl.data(), httpParser->mUrl.size(), 0, &u);
    if (result != 0)
    {
        return -1;
    }

    if (!(u.field_set & (1 << UF_PATH)))
    {
        fprintf(stderr, "\n\n*** failed to parse PATH in URL %s ***\n\n", httpParser->mUrl.c_str());
        return -1;
    }

    httpParser->mPath = std::string(httpParser->mUrl.data() + u.field_data[UF_PATH].off, u.field_data[UF_PATH].len);
    if ((u.field_set & (1 << UF_QUERY)))
    {
        httpParser->mQuery = std::string(httpParser->mUrl.data() + u.field_data[UF_QUERY].off, u.field_data[UF_QUERY].len);
    }

    return 0;
}